

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  pointer ppFVar1;
  Printer *field;
  FieldDescriptor *this_01;
  int iVar2;
  bool bVar3;
  uint uVar4;
  CppType CVar5;
  FieldGenerator *pFVar6;
  ulong uVar7;
  LogMessage *pLVar8;
  Descriptor *pDVar9;
  uint uVar10;
  int __c;
  int __c_00;
  uint extraout_EDX;
  uint i_00;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar11;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_01;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  int i;
  uint n;
  int iVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  Printer *pPStack_c0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_94;
  string first_field_name;
  string last_field_name;
  
  pcVar13 = 
  "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n";
  io::Printer::Print(printer,
                     "void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    pcVar13 = "_extensions_.Clear();\n";
    io::Printer::Print(printer,"_extensions_.Clear();\n");
  }
  this_00 = &this->field_generators_;
  iVar18 = 0;
  iVar12 = -1;
  do {
    do {
      iVar17 = iVar18;
      uVar19 = (ulong)iVar17;
      if ((ulong)((long)(this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->optimized_order_).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar19) {
        lVar16 = 0;
        for (lVar20 = 0; pDVar9 = this->descriptor_, lVar20 < *(int *)(pDVar9 + 0x38);
            lVar20 = lVar20 + 1) {
          io::Printer::Print(printer,"clear_$oneof_name$();\n","oneof_name",
                             *(string **)(*(long *)(pDVar9 + 0x40) + lVar16));
          lVar16 = lVar16 + 0x30;
        }
        if (this->num_weak_fields_ != 0) {
          io::Printer::Print(printer,"_weak_field_map_.ClearAll();\n");
          pDVar9 = this->descriptor_;
        }
        if ((*(int *)(*(long *)(pDVar9 + 0x10) + 0x8c) != 3) &&
           (io::Printer::Print(printer,"_has_bits_.Clear();\n"),
           *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3)) {
          io::Printer::Print(printer,"_internal_metadata_.Clear();\n");
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
        return;
      }
      if (iVar17 == iVar12) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xa49);
        pcVar13 = (char *)internal::LogMessage::operator<<
                                    ((LogMessage *)&first_field_name,
                                     "CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&last_field_name,(LogMessage *)pcVar13);
        internal::LogMessage::~LogMessage((LogMessage *)&first_field_name);
      }
      for (; ppFVar1 = (this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start, pPStack_c0 = (Printer *)pcVar13,
          uVar19 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
          uVar19 = uVar19 + 1) {
        field = (Printer *)ppFVar1[uVar19];
        pPStack_c0 = field;
        pFVar6 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)field);
        if (*(int *)&field->field_0x4c != 3) break;
        if ((this->use_dependent_base_ == true) &&
           (bVar3 = IsFieldDependent((FieldDescriptor *)field), bVar3)) {
          FieldName_abi_cxx11_(&first_field_name,(cpp *)field,field_00);
          pcVar13 = "clear_$name$();\n";
          io::Printer::Print(printer,"clear_$name$();\n","name",&first_field_name);
          std::__cxx11::string::~string((string *)&first_field_name);
        }
        else {
          pcVar13 = &printer->variable_delimiter_;
          (*pFVar6->_vptr_FieldGenerator[10])(pFVar6);
        }
      }
      n = 0;
      local_a8 = -1;
      uVar15 = 0xffffffffffffffff;
      local_a0 = local_a8;
      local_94 = local_a8;
      for (; ppFVar1 = (this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
          uVar19 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
          uVar19 = uVar19 + 1) {
        pFVar11 = ppFVar1[uVar19];
        bVar3 = anon_unknown_0::CanInitializeByZeroing(pFVar11);
        if (!bVar3) break;
        uVar10 = 0;
        if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
          pcVar13 = FieldDescriptor::index(pFVar11,&pPStack_c0->variable_delimiter_,__c);
          uVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)pcVar13];
        }
        pPStack_c0 = (Printer *)(uVar19 & 0xffffffff);
        uVar7 = (long)(int)uVar10 / 8 & 0xffffffff;
        iVar12 = (int)uVar19;
        iVar18 = iVar12;
        if (((int)uVar15 != -1) &&
           (uVar7 = uVar15, iVar18 = local_a8, (int)((long)(int)uVar10 / 8) != (int)uVar15)) break;
        local_a8 = iVar18;
        if (local_94 == -1) {
          local_94 = iVar12;
        }
        n = n | 1 << (uVar10 & 0x1f);
        uVar15 = uVar7;
        local_a0 = iVar12;
      }
      local_a4 = local_a0;
      while( true ) {
        iVar18 = (int)uVar19;
        ppFVar1 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar14 = (int)uVar15;
        pcVar13 = &pPStack_c0->variable_delimiter_;
        iVar12 = iVar17;
        if ((((ulong)((long)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <=
              uVar19) || (pFVar11 = ppFVar1[uVar19], *(int *)(pFVar11 + 0x4c) == 3)) ||
           (bVar3 = anon_unknown_0::CanInitializeByZeroing(pFVar11),
           pcVar13 = &pPStack_c0->variable_delimiter_, bVar3)) break;
        uVar10 = 0;
        if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
          pcVar13 = FieldDescriptor::index(pFVar11,&pPStack_c0->variable_delimiter_,__c_00);
          uVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)pcVar13];
        }
        pPStack_c0 = (Printer *)0x8;
        pcVar13 = (char *)0x8;
        uVar7 = (long)(int)uVar10 / 8 & 0xffffffff;
        iVar2 = iVar18;
        if ((iVar14 != -1) &&
           (uVar7 = uVar15, iVar2 = local_a8, (int)((long)(int)uVar10 / 8) != iVar14))
        goto LAB_0027c5c1;
        local_a8 = iVar2;
        n = n | 1 << (uVar10 & 0x1f);
        uVar19 = uVar19 + 1;
        uVar15 = uVar7;
        local_a4 = iVar18;
      }
    } while (iVar14 == -1);
LAB_0027c5c1:
    if (local_a8 == -1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xa9e);
      pcVar13 = (char *)internal::LogMessage::operator<<
                                  ((LogMessage *)&first_field_name,
                                   "CHECK failed: (-1) != (last_chunk_start): ");
      internal::LogFinisher::operator=((LogFinisher *)&last_field_name,(LogMessage *)pcVar13);
      internal::LogMessage::~LogMessage((LogMessage *)&first_field_name);
    }
    if (local_a4 == -1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xa9f);
      pcVar13 = (char *)internal::LogMessage::operator<<
                                  ((LogMessage *)&first_field_name,
                                   "CHECK failed: (-1) != (last_chunk_end): ");
      internal::LogFinisher::operator=((LogFinisher *)&last_field_name,(LogMessage *)pcVar13);
      internal::LogMessage::~LogMessage((LogMessage *)&first_field_name);
    }
    if (n == 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xaa0);
      pcVar13 = (char *)internal::LogMessage::operator<<
                                  ((LogMessage *)&first_field_name,
                                   "CHECK failed: (0) != (last_chunk_mask): ");
      internal::LogFinisher::operator=((LogFinisher *)&last_field_name,(LogMessage *)pcVar13);
      internal::LogMessage::~LogMessage((LogMessage *)&first_field_name);
    }
    uVar4 = popcnt(n);
    bVar21 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
    bVar3 = local_a8 != local_a4 && bVar21;
    uVar10 = CONCAT31((int3)((uint)local_a4 >> 8),bVar3);
    pFVar11 = (FieldDescriptor *)(ulong)uVar10;
    if (local_a8 != local_a4 && bVar21) {
      if ((int)uVar4 < 2) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xaaa);
        pLVar8 = internal::LogMessage::operator<<
                           ((LogMessage *)&first_field_name,"CHECK failed: (2) <= (count): ");
        internal::LogFinisher::operator=((LogFinisher *)&last_field_name,pLVar8);
LAB_0027c744:
        internal::LogMessage::~LogMessage((LogMessage *)&first_field_name);
        uVar10 = extraout_EDX;
      }
      else if (8 < uVar4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&first_field_name,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xaab);
        pLVar8 = internal::LogMessage::operator<<
                           ((LogMessage *)&first_field_name,"CHECK failed: (8) >= (count): ");
        internal::LogFinisher::operator=((LogFinisher *)&last_field_name,pLVar8);
        goto LAB_0027c744;
      }
      SimpleItoa_abi_cxx11_(&first_field_name,(protobuf *)(ulong)(uint)(iVar14 << 3),uVar10);
      SimpleItoa_abi_cxx11_(&last_field_name,(protobuf *)(ulong)n,i_00);
      pcVar13 = "if (_has_bits_[$index$ / 32] & $mask$u) {\n";
      io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                         &first_field_name,"mask",&last_field_name);
      std::__cxx11::string::~string((string *)&last_field_name);
      std::__cxx11::string::~string((string *)&first_field_name);
      io::Printer::Indent(printer);
      pFVar11 = extraout_RDX;
    }
    if (local_94 != -1) {
      if (local_94 == local_a0) {
        pFVar6 = FieldGeneratorMap::get
                           (this_00,(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[local_a0]);
        pcVar13 = &printer->variable_delimiter_;
        (*pFVar6->_vptr_FieldGenerator[10])(pFVar6);
        pFVar11 = extraout_RDX_00;
      }
      else {
        FieldName_abi_cxx11_
                  (&first_field_name,
                   (cpp *)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_94],pFVar11);
        FieldName_abi_cxx11_
                  (&last_field_name,
                   (cpp *)(this->optimized_order_).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_a0],field_01);
        pcVar13 = 
        "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
        ;
        io::Printer::Print(printer,
                           "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
                           ,"first",&first_field_name,"last",&last_field_name);
        std::__cxx11::string::~string((string *)&last_field_name);
        std::__cxx11::string::~string((string *)&first_field_name);
        pFVar11 = extraout_RDX_01;
      }
      local_a8 = local_a0 + 1;
    }
    for (lVar20 = (long)local_a8; lVar20 <= local_a4; lVar20 = lVar20 + 1) {
      this_01 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar20];
      FieldName_abi_cxx11_(&first_field_name,(cpp *)this_01,pFVar11);
      pFVar6 = FieldGeneratorMap::get(this_00,this_01);
      CVar5 = FieldDescriptor::cpp_type(this_01);
      if (((CVar5 == CPPTYPE_MESSAGE) ||
          (CVar5 = FieldDescriptor::cpp_type(this_01), CVar5 == CPPTYPE_STRING)) &&
         (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3)) {
        io::Printer::Print(printer,"if (has_$name$()) {\n","name",&first_field_name);
        bVar21 = true;
        io::Printer::Indent(printer);
      }
      else {
        bVar21 = false;
      }
      pcVar13 = &printer->variable_delimiter_;
      (*pFVar6->_vptr_FieldGenerator[10])(pFVar6);
      if (bVar21) {
        io::Printer::Outdent(printer);
        pcVar13 = "}\n";
        io::Printer::Print(printer,"}\n");
      }
      std::__cxx11::string::~string((string *)&first_field_name);
      pFVar11 = extraout_RDX_02;
    }
    if (bVar3) {
      io::Printer::Outdent(printer);
      pcVar13 = "}\n";
      io::Printer::Print(printer,"}\n");
    }
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateClear(io::Printer* printer) {
  printer->Print(
      "void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  // Step 1: Extensions
  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.Clear();\n");
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Step 2: Repeated fields don't use _has_bits_; emit code to clear them
    // here.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      const FieldGenerator& generator = field_generators_.get(field);

      if (!field->is_repeated()) {
        break;
      }

      if (use_dependent_base_ && IsFieldDependent(field)) {
        printer->Print("clear_$name$();\n", "name", FieldName(field));
      } else {
        generator.GenerateMessageClearingCode(printer);
      }
    }

    // Step 3: Greedily seek runs of fields that can be cleared by
    // memset-to-0.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;

    int memset_run_start = -1;
    int memset_run_end = -1;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];

      if (!CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      if (memset_run_start == -1) {
        memset_run_start = i;
      }

      memset_run_end = i;
      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    // Step 4: Non-repeated, non-zero initializable fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || CanInitializeByZeroing(field)) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      if (memset_run_start != -1) {
        if (memset_run_start == memset_run_end) {
          // For clarity, do not memset a single field.
          const FieldGenerator& generator =
              field_generators_.get(optimized_order_[memset_run_start]);
          generator.GenerateMessageClearingCode(printer);
        } else {
          const string first_field_name =
              FieldName(optimized_order_[memset_run_start]);
          const string last_field_name =
              FieldName(optimized_order_[memset_run_end]);

          printer->Print(
            "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
            "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n",
            "first", first_field_name,
            "last", last_field_name);
        }

        // Advance last_chunk_start to skip over the fields we zeroed/memset.
        last_chunk_start = memset_run_end + 1;
      }

      // Go back and emit clears for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const string fieldname = FieldName(field);
        const FieldGenerator& generator = field_generators_.get(field);

        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO(kenton):  Let the CppFieldGenerator decide this somehow.
        bool should_check_bit =
          field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
          field->cpp_type() == FieldDescriptor::CPPTYPE_STRING;

        bool have_enclosing_if = false;
        if (should_check_bit &&
            // If no field presence, then always clear strings/messages as well.
            HasFieldPresence(descriptor_->file())) {
          printer->Print("if (has_$name$()) {\n", "name", fieldname);
          printer->Indent();
          have_enclosing_if = true;
        }

        generator.GenerateMessageClearingCode(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Step 4: Unions.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.ClearAll();\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Step 5: Everything else.
    printer->Print("_has_bits_.Clear();\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print("_internal_metadata_.Clear();\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}